

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O0

int h261_gob(bitstream *str,h261_gob *gob)

{
  int iVar1;
  h261_macroblock *val;
  bool bVar2;
  int local_40;
  int local_3c;
  int k;
  int j;
  h261_macroblock *mb;
  uint32_t mba;
  uint32_t quant;
  int mbi;
  uint32_t gei;
  h261_gob *gob_local;
  bitstream *str_local;
  
  _mbi = gob;
  gob_local = (h261_gob *)str;
  iVar1 = vs_u(str,&gob->gquant,5);
  if (iVar1 == 0) {
    quant = 0;
    iVar1 = vs_u((bitstream *)gob_local,&quant,1);
    while (iVar1 == 0) {
      if (quant == 0) {
        mba = 0;
        mb._4_4_ = *(uint32_t *)((long)_mbi + 4);
        quant = 0;
        do {
          mb._0_4_ = 0;
          if (gob_local->gn == 0) {
            while( true ) {
              bVar2 = false;
              if ((int)mba < 0x21) {
                bVar2 = _mbi->mbs[(int)mba].mtype == 0;
              }
              if (!bVar2) break;
              iVar1 = vs_infer((bitstream *)gob_local,&_mbi->mbs[(int)mba].cbp,0);
              if (iVar1 != 0) {
                return 1;
              }
              mba = mba + 1;
              mb._0_4_ = (uint)mb + 1;
            }
            if (mba == 0x21) {
              return 0;
            }
          }
          while( true ) {
            iVar1 = vs_vlc((bitstream *)gob_local,(uint32_t *)&mb,mba_vlc);
            if (iVar1 != 0) {
              return 1;
            }
            if ((gob_local->gn == 0) || ((uint)mb < 0x21)) break;
            if ((uint)mb != 0x21) {
              while( true ) {
                if (0x20 < (int)mba) {
                  return 0;
                }
                _mbi->mbs[(int)mba].mtype = 0;
                iVar1 = vs_infer((bitstream *)gob_local,&_mbi->mbs[(int)mba].cbp,0);
                if (iVar1 != 0) break;
                mba = mba + 1;
              }
              return 1;
            }
          }
          if (gob_local->gn == 1) {
            for (; (int)mba < 0x21 && (uint)mb != 0; mba = mba + 1) {
              _mbi->mbs[(int)mba].mtype = 0;
              iVar1 = vs_infer((bitstream *)gob_local,&_mbi->mbs[(int)mba].cbp,0);
              if (iVar1 != 0) {
                return 1;
              }
              mb._0_4_ = (uint)mb - 1;
            }
            if (mba == 0x21) {
              fprintf(_stderr,"Macroblock address overrun\n");
              return 1;
            }
          }
          val = _mbi->mbs + (int)mba;
          iVar1 = vs_vlc((bitstream *)gob_local,&val->mtype,mtype_vlc);
          if (iVar1 != 0) {
            return 1;
          }
          if ((val->mtype & 3) != 0) {
            if ((val->mtype & 4) == 0) {
              iVar1 = vs_infer((bitstream *)gob_local,&val->mquant,mb._4_4_);
              if (iVar1 != 0) {
                return 1;
              }
            }
            else {
              iVar1 = vs_u((bitstream *)gob_local,&val->mquant,5);
              if (iVar1 != 0) {
                return 1;
              }
              mb._4_4_ = val->mquant;
            }
          }
          if ((val->mtype & 8) != 0) {
            iVar1 = vs_vlc((bitstream *)gob_local,val->mvd,mvd_vlc);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = vs_vlc((bitstream *)gob_local,val->mvd + 1,mvd_vlc);
            if (iVar1 != 0) {
              return 1;
            }
          }
          if ((val->mtype & 1) == 0) {
            if ((val->mtype & 2) == 0) {
              iVar1 = vs_infer((bitstream *)gob_local,&val->cbp,0);
              if (iVar1 != 0) {
                return 1;
              }
            }
            else {
              iVar1 = vs_infer((bitstream *)gob_local,&val->cbp,0x3f);
              if (iVar1 != 0) {
                return 1;
              }
            }
          }
          else {
            iVar1 = vs_vlc((bitstream *)gob_local,&val->cbp,cbp_vlc);
            if (iVar1 != 0) {
              return 1;
            }
          }
          for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
            if ((val->cbp & 1 << ((byte)local_3c & 0x1f)) == 0) {
              for (local_40 = 0; local_40 < 0x40; local_40 = local_40 + 1) {
                iVar1 = vs_infers((bitstream *)gob_local,val->block[local_3c] + local_40,0);
                if (iVar1 != 0) {
                  return 1;
                }
              }
            }
            else {
              iVar1 = h261_block((bitstream *)gob_local,val->block[local_3c],val->mtype & 2);
              if (iVar1 != 0) {
                return 1;
              }
            }
          }
          mba = mba + 1;
        } while( true );
      }
      iVar1 = vs_u((bitstream *)gob_local,&quant,8);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_u((bitstream *)gob_local,&quant,1);
    }
  }
  return 1;
}

Assistant:

int h261_gob(struct bitstream *str, struct h261_gob *gob) {
	if (vs_u(str, &gob->gquant, 5)) return 1;
	uint32_t gei = 0;
	if (vs_u(str, &gei, 1)) return 1;
	while (gei) {
		if (vs_u(str, &gei, 8)) return 1;
		if (vs_u(str, &gei, 1)) return 1;
	}
	int mbi = 0;
	uint32_t quant = gob->gquant;
	while (1) {
		uint32_t mba = 0;
		if (str->dir == VS_ENCODE) {
			while (mbi < H261_GOB_MBS && gob->mbs[mbi].mtype == 0) {
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba++;
			}
		       	if (mbi == H261_GOB_MBS)
				return 0;
		}
		while (1) {
			if (vs_vlc(str, &mba, mba_vlc)) return 1;
			if (str->dir == VS_ENCODE || mba < 33)
				break;
			if (mba == 33) /* stuffing */
				continue;
			/* end */
			while (mbi < H261_GOB_MBS) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++;
			}
			return 0;
		}
		if (str->dir == VS_DECODE) {
			while (mbi < H261_GOB_MBS && mba) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba--;
			}
			if (mbi == H261_GOB_MBS) {
				fprintf(stderr, "Macroblock address overrun\n");
				return 1;
			}
		}
		struct h261_macroblock *mb = &gob->mbs[mbi];
		if (vs_vlc(str, &mb->mtype, mtype_vlc)) return 1;
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA)) {
			if (mb->mtype & H261_MTYPE_FLAG_QUANT) {
				if (vs_u(str, &mb->mquant, 5)) return 1;
				quant = mb->mquant;
			} else {
				if (vs_infer(str, &mb->mquant, quant)) return 1;
			}
		}
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			if (vs_vlc(str, &mb->mvd[0], mvd_vlc)) return 1;
			if (vs_vlc(str, &mb->mvd[1], mvd_vlc)) return 1;
		}
		if (mb->mtype & H261_MTYPE_FLAG_CODED) {
			if (vs_vlc(str, &mb->cbp, cbp_vlc)) return 1;
		} else if (mb->mtype & H261_MTYPE_FLAG_INTRA) {
			if (vs_infer(str, &mb->cbp, 0x3f)) return 1;
		} else {
			if (vs_infer(str, &mb->cbp, 0)) return 1;
		}
		int j, k;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				if (h261_block(str, mb->block[j], mb->mtype & H261_MTYPE_FLAG_INTRA)) return 1;
			} else {
				for (k = 0; k < 64; k++)
					if (vs_infers(str, &mb->block[j][k], 0)) return 1;
			}
		}
		mbi++;
	}
	return 0;
}